

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O3

BN * Garner(BN *__return_storage_ptr__,vector<BN,_std::allocator<BN>_> *m,
           vector<BN,_std::allocator<BN>_> *v)

{
  vector<BN,_std::allocator<BN>_> *pvVar1;
  bool bVar2;
  long lVar3;
  invalid_argument *this;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  BN *x;
  BN Pm;
  BN u;
  vector<BN,_std::allocator<BN>_> C;
  BN xmi;
  BN vix;
  long local_130;
  BN local_120;
  BN local_108;
  vector<BN,_std::allocator<BN>_> *local_f0;
  BN local_e8;
  vector<BN,_std::allocator<BN>_> local_d0;
  ulong local_b8;
  ulong local_b0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  lVar3 = (long)(m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                _M_start;
  if (lVar3 == (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    uVar4 = (int)(lVar3 >> 3) * -0x55555555;
    std::vector<BN,_std::allocator<BN>_>::vector
              (&local_d0,(long)(int)uVar4,(allocator_type *)&local_e8);
    local_f0 = v;
    BN::BN(&local_e8);
    if (1 < (int)uVar4) {
      local_b8 = (ulong)(uVar4 & 0x7fffffff);
      uVar5 = 1;
      do {
        BN::bn1();
        BN::operator=(local_d0.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar5,&local_120);
        if (local_120.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        lVar3 = 0;
        uVar6 = uVar5;
        local_b0 = uVar5;
        do {
          BN::BN(&local_90,
                 (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                 super__Vector_impl_data._M_start)->ba).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl + lVar3));
          BN::BN(&local_48,
                 (m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                 _M_start + uVar5);
          gcdInverseEuclideanBinary(&local_120,&local_90,&local_48);
          BN::operator=(&local_e8,&local_120);
          if (local_120.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          BN::operator*(&local_a8,&local_e8,
                        local_d0.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar5);
          BN::operator%(&local_120,&local_a8,
                        (m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                        super__Vector_impl_data._M_start + uVar5);
          BN::operator=(local_d0.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar5,&local_120);
          if (local_120.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          lVar3 = lVar3 + 0x18;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        uVar5 = local_b0 + 1;
      } while (uVar5 != local_b8);
    }
    BN::operator=(&local_e8,
                  (local_f0->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                  super__Vector_impl_data._M_start);
    BN::BN(__return_storage_ptr__,&local_e8);
    BN::bn1();
    if (1 < (int)uVar4) {
      local_130 = (ulong)(uVar4 & 0x7fffffff) - 1;
      lVar3 = 0x18;
      do {
        BN::operator%(&local_a8,__return_storage_ptr__,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        pvVar1 = local_f0;
        bVar2 = BN::operator>=((BN *)((long)&(((local_f0->
                                               super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                               super__Vector_impl_data._M_start)->ba).
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl + lVar3),&local_a8);
        if (bVar2) {
          BN::operator-(&local_60,
                        (BN *)((long)&(((pvVar1->super__Vector_base<BN,_std::allocator<BN>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->ba).
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl + lVar3),&local_a8);
        }
        else {
          BN::operator+(&local_108,
                        (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                        super__Vector_impl_data._M_start)->ba).
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl + lVar3),
                        (BN *)((long)&(((pvVar1->super__Vector_base<BN,_std::allocator<BN>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->ba).
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl + lVar3));
          BN::operator-(&local_60,&local_108,&local_a8);
          if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        BN::operator*(&local_78,&local_60,
                      (BN *)((long)&((local_d0.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar3));
        BN::operator%(&local_108,&local_78,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        BN::operator=(&local_e8,&local_108);
        if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        BN::operator*(&local_108,&local_120,
                      (BN *)((long)&(m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                    super__Vector_impl_data._M_start[-1].ba.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        BN::operator=(&local_120,&local_108);
        if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        BN::operator*(&local_108,&local_e8,&local_120);
        BN::operator+=(__return_storage_ptr__,&local_108);
        if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        lVar3 = lVar3 + 0x18;
        local_130 = local_130 + -1;
      } while (local_130 != 0);
    }
    if (local_120.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<BN,_std::allocator<BN>_>::~vector(&local_d0);
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Garner: Sizes of arrays are different");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BN Garner(const std::vector <BN>& m, const std::vector <BN>& v)
{
    if(m.size()!=v.size())
        throw invalid_argument("Garner: Sizes of arrays are different");
    int t = m.size();
    vector<BN> C(t);
    BN u;
    for(int i=1;i<t;i++)
    {
        C[i] = BN::bn1();
        for(int j=0; j<i; j++)
        {
            u = gcdInverseEuclideanBinary(m[j],m[i]);
            C[i] = u * C[i] % m[i];
        }
    }
    u = v[0];
    BN x = u;
    BN Pm(BN::bn1());
    for(int i=1;i<t;i++)
    {
        BN xmi = x%m[i];
        BN vix = (v[i] >= xmi ? v[i] - xmi : m[i] + v[i] - xmi);
        //u = (v[i] - x) * C[i] % m[i];
        u = vix * C[i] % m[i];
        Pm = Pm * m[i-1];
        x += u * Pm;
    }
    return x;
}